

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::DisplayOutputs(cmCursesMainForm *this,string *newOutput)

{
  cmCursesForm *pcVar1;
  pointer pcVar2;
  cmCursesLongMessageForm *this_00;
  char *title;
  uint local_48;
  uint local_44;
  cmCursesLongMessageForm *newLogForm;
  int yi;
  int xi;
  string *newOutput_local;
  cmCursesMainForm *this_local;
  
  pcVar1 = cmCursesForm::CurrentForm;
  if (_stdscr == 0) {
    local_44 = 0xffffffff;
    local_48 = 0xffffffff;
  }
  else {
    local_44 = (int)*(short *)(_stdscr + 4) + 1;
    local_48 = (int)*(short *)(_stdscr + 6) + 1;
  }
  pcVar2 = std::unique_ptr<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>::
           get(&this->LogForm);
  if ((pointer)pcVar1 == pcVar2) {
    pcVar2 = std::unique_ptr<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
             ::operator->(&this->LogForm);
    cmCursesLongMessageForm::UpdateContent(pcVar2,newOutput,&this->LastProgress);
  }
  else {
    this_00 = (cmCursesLongMessageForm *)operator_new(0x68);
    title = (char *)std::__cxx11::string::c_str();
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Outputs,title,ScrollDown);
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    std::unique_ptr<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>::reset
              (&this->LogForm,this_00);
    pcVar2 = std::unique_ptr<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
             ::operator->(&this->LogForm);
    (*(pcVar2->super_cmCursesForm)._vptr_cmCursesForm[3])
              (pcVar2,1,1,(ulong)local_48,(ulong)local_44);
  }
  return;
}

Assistant:

void cmCursesMainForm::DisplayOutputs(std::string const& newOutput)
{
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);

  if (CurrentForm != this->LogForm.get()) {
    auto* newLogForm = new cmCursesLongMessageForm(
      this->Outputs, this->LastProgress.c_str(),
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    CurrentForm = newLogForm;
    this->LogForm.reset(newLogForm);
    this->LogForm->Render(1, 1, xi, yi);
  } else {
    this->LogForm->UpdateContent(newOutput, this->LastProgress);
  }
}